

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_scalar_shift_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  byte bVar1;
  bool bVar2;
  uint opcode;
  TCGv_i64 pTVar3;
  TCGv_i64 ret;
  uint rd;
  _Bool _Var4;
  TCGContext_conflict1 *s_00;
  _Bool _Var5;
  uint32_t target_el;
  uint rn;
  uintptr_t o_3;
  TCGTemp *pTVar6;
  uint immb;
  uintptr_t o_1;
  uint uVar7;
  int iVar8;
  uintptr_t o;
  int in_stack_ffffffffffffff98;
  TCGv_i64 local_60;
  TCGv_i64 local_50;
  
  uVar7 = insn >> 0x13 & 0xf;
  if ((uVar7 == 0) || (opcode = insn >> 0xb & 0x1f, 0x1f < opcode)) goto switchD_006ade6d_caseD_1;
  rd = insn & 0x1f;
  rn = insn >> 5 & 0x1f;
  immb = insn >> 0x10 & 7;
  bVar1 = (byte)(insn >> 0x18);
  switch(opcode) {
  case 0:
  case 2:
  case 4:
  case 6:
    goto switchD_006ade6d_caseD_0;
  case 8:
    if ((insn >> 0x1d & 1) == 0) break;
switchD_006ade6d_caseD_0:
    if ((insn >> 0x16 & 1) == 0) break;
    if (s->fp_access_checked == true) {
LAB_006ae33c:
      __assert_fail("!s->fp_access_checked",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x487,"_Bool fp_access_check(DisasContext *)");
    }
    s_00 = s->uc->tcg_ctx;
    s->fp_access_checked = true;
    target_el = s->fp_excp_el;
    if (target_el != 0) {
LAB_006adeaa:
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,target_el);
      return;
    }
    iVar8 = immb + uVar7 * 8;
    bVar2 = false;
    switch(opcode) {
    case 2:
      _Var5 = true;
      bVar2 = false;
      break;
    default:
      local_50 = read_fp_dreg((DisasContext_conflict1 *)s_00,rn);
      local_60 = (TCGv_i64)0x0;
      bVar2 = false;
      goto LAB_006ae1fa;
    case 4:
      goto switchD_006ae0cf_caseD_4;
    case 6:
      bVar2 = true;
      goto switchD_006ae0cf_caseD_4;
    case 8:
      bVar2 = true;
      _Var5 = false;
    }
    local_50 = read_fp_dreg((DisasContext_conflict1 *)s_00,rn);
    pTVar3 = read_fp_dreg((DisasContext_conflict1 *)s->uc->tcg_ctx,rd);
    if (bVar2) {
      if (iVar8 == 0x40) {
        bVar2 = false;
        local_60 = (TCGv_i64)0x0;
      }
      else {
        tcg_gen_shri_i64_aarch64(s_00,local_50,local_50,(ulong)(0x80U - iVar8));
        bVar2 = false;
        tcg_gen_deposit_i64_aarch64(s_00,pTVar3,pTVar3,local_50,0,iVar8 - 0x40);
        local_60 = (TCGv_i64)0x0;
      }
    }
    else {
      bVar2 = false;
      local_60 = (TCGv_i64)0x0;
LAB_006ae214:
      handle_shri_with_rndacc
                (s_00,pTVar3,local_50,local_60,_Var5,(_Bool)(bVar1 >> 5 & 1),3,0x80U - iVar8);
    }
    write_fp_dreg_aarch64(s,rd,pTVar3);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(local_50 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
    if (!bVar2) {
      return;
    }
    pTVar6 = (TCGTemp *)(local_60 + (long)s_00);
LAB_006ae2d8:
    tcg_temp_free_internal_aarch64(s_00,pTVar6);
    return;
  case 10:
    s_00 = s->uc->tcg_ctx;
    iVar8 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    new_tmp_a64_aarch64(s);
    new_tmp_a64_aarch64(s);
    if ((insn >> 0x16 & 1) == 0) break;
    if (s->fp_access_checked == true) goto LAB_006ae33c;
    s->fp_access_checked = true;
    target_el = s->fp_excp_el;
    if (target_el != 0) goto LAB_006adeaa;
    uVar7 = immb + uVar7 * 8 + (-8 << ((byte)iVar8 & 0x1f));
    pTVar3 = read_fp_dreg((DisasContext_conflict1 *)s->uc->tcg_ctx,rn);
    if ((insn >> 0x1d & 1) == 0) {
      pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      ret = (TCGv_i64)((long)pTVar6 - (long)s_00);
      tcg_gen_shli_i64_aarch64(s_00,ret,pTVar3,(long)(int)uVar7);
    }
    else {
      ret = read_fp_dreg((DisasContext_conflict1 *)s->uc->tcg_ctx,rd);
      tcg_gen_deposit_i64_aarch64(s_00,ret,ret,pTVar3,uVar7,0x40 - uVar7);
    }
    write_fp_dreg_aarch64(s,rd,ret);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
    pTVar6 = (TCGTemp *)(ret + (long)s_00);
    goto LAB_006ae2d8;
  case 0xc:
    if ((insn >> 0x1d & 1) != 0) {
      _Var4 = false;
      _Var5 = true;
      goto LAB_006ae03e;
    }
    break;
  case 0xe:
    _Var4 = (_Bool)(bVar1 >> 5 & 1);
    _Var5 = _Var4;
LAB_006ae03e:
    handle_simd_qshl(s,true,false,_Var4,_Var5,uVar7,immb,rn,rd);
    return;
  case 0x10:
  case 0x11:
    if ((insn >> 0x1d & 1) != 0) {
      _Var4 = false;
      _Var5 = true;
      goto LAB_006adf01;
    }
    break;
  case 0x12:
  case 0x13:
    _Var4 = (_Bool)(bVar1 >> 5 & 1);
    _Var5 = _Var4;
LAB_006adf01:
    handle_vec_simd_sqshrn(s,true,false,_Var4,_Var5,uVar7,immb,opcode,rn,rd);
    return;
  case 0x1c:
    handle_simd_shift_intfp_conv
              (s,true,false,(_Bool)(bVar1 >> 5 & 1),uVar7,immb,rn,rd,in_stack_ffffffffffffff98);
    return;
  case 0x1f:
    handle_simd_shift_fpint_conv(s,true,false,(_Bool)(bVar1 >> 5 & 1),uVar7,immb,rn,rd);
    return;
  }
switchD_006ade6d_caseD_1:
  unallocated_encoding_aarch64(s);
  return;
switchD_006ae0cf_caseD_4:
  local_60 = tcg_const_i64_aarch64(s_00,1L << (~(byte)iVar8 & 0x3f));
  local_50 = read_fp_dreg((DisasContext_conflict1 *)s->uc->tcg_ctx,rn);
  if (bVar2) {
    pTVar3 = read_fp_dreg((DisasContext_conflict1 *)s->uc->tcg_ctx,rd);
    _Var5 = true;
    bVar2 = true;
  }
  else {
    bVar2 = true;
LAB_006ae1fa:
    pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    _Var5 = false;
    pTVar3 = (TCGv_i64)((long)pTVar6 - (long)s_00);
  }
  goto LAB_006ae214;
}

Assistant:

static void disas_simd_scalar_shift_imm(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 5);
    int immb = extract32(insn, 16, 3);
    int immh = extract32(insn, 19, 4);
    bool is_u = extract32(insn, 29, 1);

    if (immh == 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0x08: /* SRI */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x00: /* SSHR / USHR */
    case 0x02: /* SSRA / USRA */
    case 0x04: /* SRSHR / URSHR */
    case 0x06: /* SRSRA / URSRA */
        handle_scalar_simd_shri(s, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x0a: /* SHL / SLI */
        handle_scalar_simd_shli(s, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x1c: /* SCVTF, UCVTF */
        handle_simd_shift_intfp_conv(s, true, false, is_u, immh, immb,
                                     opcode, rn, rd);
        break;
    case 0x10: /* SQSHRUN, SQSHRUN2 */
    case 0x11: /* SQRSHRUN, SQRSHRUN2 */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_vec_simd_sqshrn(s, true, false, false, true,
                               immh, immb, opcode, rn, rd);
        break;
    case 0x12: /* SQSHRN, SQSHRN2, UQSHRN */
    case 0x13: /* SQRSHRN, SQRSHRN2, UQRSHRN, UQRSHRN2 */
        handle_vec_simd_sqshrn(s, true, false, is_u, is_u,
                               immh, immb, opcode, rn, rd);
        break;
    case 0xc: /* SQSHLU */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_simd_qshl(s, true, false, false, true, immh, immb, rn, rd);
        break;
    case 0xe: /* SQSHL, UQSHL */
        handle_simd_qshl(s, true, false, is_u, is_u, immh, immb, rn, rd);
        break;
    case 0x1f: /* FCVTZS, FCVTZU */
        handle_simd_shift_fpint_conv(s, true, false, is_u, immh, immb, rn, rd);
        break;
    default:
        unallocated_encoding(s);
        break;
    }
}